

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::encoder_strategy>
::jls_codec(jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::encoder_strategy>
            *this,default_traits<unsigned_short,_charls::quad<unsigned_short>_> traits,
           frame_info *frame_info,coding_parameters *parameters)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  interleave_mode iVar6;
  color_transformation cVar7;
  undefined3 uVar8;
  default_traits<unsigned_short,_charls::quad<unsigned_short>_> dVar9;
  ulong uVar10;
  long lVar11;
  
  dVar9 = traits;
  uVar4 = frame_info->width;
  uVar5 = frame_info->height;
  uVar2._0_4_ = frame_info->bits_per_sample;
  uVar2._4_4_ = frame_info->component_count;
  uVar10 = uVar2 & 0xffffffff | 0x100000000;
  if (parameters->interleave_mode != None) {
    uVar10 = uVar2;
  }
  (this->super_encoder_strategy)._vptr_encoder_strategy =
       (_func_int **)&PTR__encoder_strategy_0014a980;
  (this->super_encoder_strategy).frame_info_.width = uVar4;
  (this->super_encoder_strategy).frame_info_.height = uVar5;
  (this->super_encoder_strategy).frame_info_.bits_per_sample = (int)uVar10;
  (this->super_encoder_strategy).frame_info_.component_count = (int)(uVar10 >> 0x20);
  uVar4 = parameters->restart_interval;
  iVar6 = parameters->interleave_mode;
  cVar7 = parameters->transformation;
  (this->super_encoder_strategy).parameters_.near_lossless = parameters->near_lossless;
  (this->super_encoder_strategy).parameters_.restart_interval = uVar4;
  (this->super_encoder_strategy).parameters_.interleave_mode = iVar6;
  (this->super_encoder_strategy).parameters_.transformation = cVar7;
  uVar8 = *(undefined3 *)&parameters->field_0x11;
  (this->super_encoder_strategy).parameters_.output_bgr = parameters->output_bgr;
  *(undefined3 *)&(this->super_encoder_strategy).parameters_.field_0x11 = uVar8;
  (this->super_encoder_strategy).decoder_._M_t.
  super___uniq_ptr_impl<charls::decoder_strategy,_std::default_delete<charls::decoder_strategy>_>.
  _M_t.
  super__Tuple_impl<0UL,_charls::decoder_strategy_*,_std::default_delete<charls::decoder_strategy>_>
  .super__Head_base<0UL,_charls::decoder_strategy_*,_false>._M_head_impl = (decoder_strategy *)0x0;
  (this->super_encoder_strategy).process_line_._M_t.
  super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>._M_t.
  super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>.
  super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl = (process_line *)0x0;
  (this->super_encoder_strategy).bit_buffer_ = 0;
  (this->super_encoder_strategy).free_bit_count_ = 0x20;
  (this->super_encoder_strategy).bytes_written_ = 0;
  (this->super_encoder_strategy).compressed_length_ = 0;
  (this->super_encoder_strategy).position_ = (uint8_t *)0x0;
  (this->super_encoder_strategy).is_ff_written_ = false;
  (this->super_encoder_strategy)._vptr_encoder_strategy = (_func_int **)&PTR__jls_codec_0014ac88;
  uVar3 = traits._8_8_;
  (this->traits_).maximum_sample_value = traits.maximum_sample_value;
  (this->traits_).near_lossless = traits.near_lossless;
  (this->traits_).range = (int)uVar3;
  (this->traits_).quantized_bits_per_pixel = (int)((ulong)uVar3 >> 0x20);
  (this->traits_).quantized_bits_per_pixel = (int)dVar9._12_8_;
  (this->traits_).bits_per_pixel = (int)((ulong)dVar9._12_8_ >> 0x20);
  (this->traits_).limit = traits.limit;
  (this->traits_).reset_threshold = traits.reset_threshold;
  (this->rect_).X = 0;
  (this->rect_).Y = 0;
  (this->rect_).Width = 0;
  (this->rect_).Height = 0;
  this->width_ = frame_info->width;
  this->restart_interval_ = 0;
  this->restart_interval_counter_ = 0;
  this->t1_ = 0;
  this->t2_ = 0;
  *(undefined8 *)((long)&this->t2_ + 1) = 0;
  lVar11 = 0xb0;
  do {
    puVar1 = (undefined8 *)((long)&(this->super_encoder_strategy)._vptr_encoder_strategy + lVar11);
    *puVar1 = 0;
    puVar1[1] = 0x100000000;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x1780);
  lVar11 = 0;
  do {
    *(undefined8 *)((long)&(this->context_run_mode_)._M_elems[0].run_interruption_type_ + lVar11) =
         0;
    *(undefined2 *)(&(this->context_run_mode_)._M_elems[0].n_ + lVar11) = 1;
    lVar11 = lVar11 + 0xc;
  } while (lVar11 != 0x18);
  this->run_index_ = 0;
  this->previous_line_ = (pixel_type *)0x0;
  this->current_line_ = (pixel_type *)0x0;
  this->quantization_ = (int8_t *)0x0;
  (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((parameters->interleave_mode == None) && ((uVar10 & 0xffffffff00000000) != 0x100000000)) {
    __assert_fail("(parameters.interleave_mode == interleave_mode::none && this->frame_info().component_count == 1) || parameters.interleave_mode != interleave_mode::none"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x6b,
                  "charls::jls_codec<charls::default_traits<unsigned short, charls::quad<unsigned short>>, charls::encoder_strategy>::jls_codec(Traits, const frame_info &, const coding_parameters &) [Traits = charls::default_traits<unsigned short, charls::quad<unsigned short>>, Strategy = charls::encoder_strategy]"
                 );
  }
  if (((this->traits_).maximum_sample_value - 1U < 0xffff) &&
     ((this->traits_).bits_per_pixel - 1U < 0x10)) {
    return;
  }
  __assert_fail("traits_.is_valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                ,0x6c,
                "charls::jls_codec<charls::default_traits<unsigned short, charls::quad<unsigned short>>, charls::encoder_strategy>::jls_codec(Traits, const frame_info &, const coding_parameters &) [Traits = charls::default_traits<unsigned short, charls::quad<unsigned short>>, Strategy = charls::encoder_strategy]"
               );
}

Assistant:

jls_codec(Traits traits, const frame_info& frame_info, const coding_parameters& parameters) noexcept :
        Strategy{update_component_count(frame_info, parameters), parameters},
        traits_{std::move(traits)},
        width_{frame_info.width}
    {
        ASSERT((parameters.interleave_mode == interleave_mode::none && this->frame_info().component_count == 1) ||
               parameters.interleave_mode != interleave_mode::none);
        ASSERT(traits_.is_valid());
    }